

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O3

compile_errcode __thiscall Default::Parse(Default *this)

{
  pointer pcVar1;
  SymbolName SVar2;
  compile_errcode cVar3;
  Statement *pSVar4;
  int iVar5;
  undefined1 local_50 [32];
  
  iVar5 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (iVar5 == 0) {
      iVar5 = 1;
      if (SVar2 != DEFAULT_SYM) {
        return -1;
      }
    }
    else {
      if (iVar5 != 1) {
        pSVar4 = (Statement *)operator_new(0x1e8);
        (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172618;
        (pSVar4->m_output_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172510;
        (pSVar4->m_output_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar4->m_output_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar4->m_input_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172460;
        (pSVar4->m_return_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001724b8;
        (pSVar4->m_return_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar4->m_return_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172568;
        (pSVar4->m_assign_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar4->m_assign_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p =
             (pointer)&(pSVar4->m_assign_statement).m_identifier_name.field_2;
        (pSVar4->m_assign_statement).m_identifier_name._M_string_length = 0;
        (pSVar4->m_assign_statement).m_identifier_name.field_2._M_local_buf[0] = '\0';
        (pSVar4->m_function_call).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172670;
        (pSVar4->m_function_call).m_value_argument_list.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001722a8;
        (pSVar4->m_function_call).m_value_argument_list.m_expression.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
        (pSVar4->m_function_call).m_value_argument_list.m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001726c8;
        (pSVar4->m_condition_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_001725c0;
        (pSVar4->m_condition_statement).m_condition.m_expression.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
        (pSVar4->m_condition_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p =
             (pointer)&(pSVar4->m_condition_statement).m_bottom_label.field_2;
        (pSVar4->m_condition_statement).m_bottom_label._M_string_length = 0;
        (pSVar4->m_condition_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
        (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172720;
        (pSVar4->m_while_loop_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_001725c0;
        (pSVar4->m_while_loop_statement).m_condition.m_expression.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
        (pSVar4->m_while_loop_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p =
             (pointer)&(pSVar4->m_while_loop_statement).m_top_label.field_2;
        (pSVar4->m_while_loop_statement).m_top_label._M_string_length = 0;
        (pSVar4->m_while_loop_statement).m_top_label.field_2._M_local_buf[0] = '\0';
        (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p =
             (pointer)&(pSVar4->m_while_loop_statement).m_bottom_label.field_2;
        (pSVar4->m_while_loop_statement).m_bottom_label._M_string_length = 0;
        (pSVar4->m_while_loop_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
        (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172778;
        (pSVar4->m_switch_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar4->m_switch_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar4->m_switch_statement).m_switch_table.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_001727d0;
        (pSVar4->m_switch_statement).m_switch_table.m_switch_child_statement.super_AnalysisInterface
        ._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172828;
        (pSVar4->m_switch_statement).m_default.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172880;
        (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p =
             (pointer)&(pSVar4->m_switch_statement).m_bottom_label.field_2;
        (pSVar4->m_switch_statement).m_bottom_label._M_string_length = 0;
        (pSVar4->m_switch_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
        this->m_statement_ptr = pSVar4;
        cVar3 = Statement::Parse(pSVar4);
        pSVar4 = this->m_statement_ptr;
        if (cVar3 == 0) {
          (*(pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface[1])(pSVar4);
          pSVar4 = this->m_statement_ptr;
          if (pSVar4 != (Statement *)0x0) {
            (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface =
                 (_func_int **)&PTR_Parse_00172618;
            (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
                 (_func_int **)&PTR_Parse_00172778;
            pcVar1 = (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar1 != &(pSVar4->m_switch_statement).m_bottom_label.field_2) {
              operator_delete(pcVar1);
            }
            (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
                 (_func_int **)&PTR_Parse_00172720;
            pcVar1 = (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar1 != &(pSVar4->m_while_loop_statement).m_bottom_label.field_2) {
              operator_delete(pcVar1);
            }
            pcVar1 = (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar1 != &(pSVar4->m_while_loop_statement).m_top_label.field_2) {
              operator_delete(pcVar1);
            }
            (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
                 (_func_int **)&PTR_Parse_001726c8;
            pcVar1 = (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar1 != &(pSVar4->m_condition_statement).m_bottom_label.field_2) {
              operator_delete(pcVar1);
            }
            (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
                 (_func_int **)&PTR_Parse_00172568;
            pcVar1 = (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar1 != &(pSVar4->m_assign_statement).m_identifier_name.field_2) {
              operator_delete(pcVar1);
            }
          }
          operator_delete(pSVar4);
          return 0;
        }
        if (pSVar4 != (Statement *)0x0) {
          (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172618;
          (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172778;
          pcVar1 = (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar4->m_switch_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172720;
          pcVar1 = (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar4->m_while_loop_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          pcVar1 = (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar4->m_while_loop_statement).m_top_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_001726c8;
          pcVar1 = (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar4->m_condition_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172568;
          pcVar1 = (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar4->m_assign_statement).m_identifier_name.field_2) {
            operator_delete(pcVar1);
          }
        }
        goto LAB_0012c867;
      }
      iVar5 = 2;
      if (SVar2 != COLON_SYM) {
        local_50._16_6_ = 0x746365707865;
        local_50._22_2_ = 0x6465;
        local_50._24_6_ = 0x273a27206120;
        local_50._8_8_ = 0xe;
        local_50[0x1e] = '\0';
        local_50._0_8_ = (Statement *)(local_50 + 0x10);
        GrammaErrorLogs(g_log_tools,(string *)local_50);
        pSVar4 = (Statement *)local_50._0_8_;
        if ((Statement *)local_50._0_8_ != (Statement *)(local_50 + 0x10)) {
LAB_0012c867:
          operator_delete(pSVar4);
        }
        return -1;
      }
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode Default::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == DEFAULT_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COLON_SYM) {
                    state = 2;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ':'");
                    return NOT_MATCH;
                }
            }
            case 2: {
                m_statement_ptr = new Statement;
                if ((ret = m_statement_ptr->Parse()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    delete(m_statement_ptr);
                    return COMPILE_OK;
                } else {
                    delete(m_statement_ptr);
                    return NOT_MATCH;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}